

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitSimdMemAccess
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature,ViewType viewType,
          uint8 dataWidth,bool isStore)

{
  WasmType type;
  uint32 uVar1;
  WasmBinaryReader *pWVar2;
  EmitInfo EVar3;
  WasmRegisterSpace *this_00;
  EmitInfo EVar4;
  WasmCompilationException *this_01;
  undefined6 in_register_00000032;
  undefined7 in_register_00000081;
  EmitInfo local_48;
  EmitInfo local_40;
  EmitInfo exprInfo;
  
  exprInfo.super_EmitInfoBase.location = (RegSlot)CONCAT71(in_register_00000081,dataWidth);
  exprInfo.type = (WasmType)CONCAT62(in_register_00000032,op);
  type = *signature;
  SetUsesMemory(this,0);
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  if ((pWVar2->super_WasmReaderBase).m_currentNode.field_1.mem.alignment < 0x11) {
    uVar1 = (pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
    if (isStore) {
      EVar3 = PopEvalStack(this,type,L"Invalid type for store op");
      local_48 = EVar3;
      local_40 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
                (this->m_writer,(ulong)(ushort)(undefined2)exprInfo.type,(ulong)EVar3 & 0xffffffff,
                 (ulong)local_40 & 0xffffffff,(ulong)(byte)exprInfo.super_EmitInfoBase.location,
                 (ulong)viewType,uVar1);
      ReleaseLocation(this,&local_48);
      ReleaseLocation(this,&local_40);
      EVar4.super_EmitInfoBase.location = 0xffffffff;
      EVar4.type = Void;
    }
    else {
      EVar3 = PopEvalStack(this,FirstLocalType,L"Index expression must be of type i32");
      local_40 = EVar3;
      this_00 = GetRegisterSpace(this,type);
      EVar4.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
      (*this->m_writer->_vptr_IWasmByteCodeWriter[0x16])
                (this->m_writer,(ulong)(ushort)(undefined2)exprInfo.type,
                 (ulong)EVar4.super_EmitInfoBase.location,(ulong)EVar3 & 0xffffffff,
                 (ulong)(byte)exprInfo.super_EmitInfoBase.location,(ulong)viewType,uVar1);
      ReleaseLocation(this,&local_40);
      EVar4.type = type;
    }
    return EVar4;
  }
  this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (this_01,L"alignment must not be larger than natural");
  __cxa_throw(this_01,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSimdMemAccess(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature, Js::ArrayBufferView::ViewType viewType, uint8 dataWidth, bool isStore)
{

    WasmTypes::WasmType type = signature[0];
    SetUsesMemory(0);

    const uint32 naturalAlignment = 16;
    const uint alignment = GetReader()->m_currentNode.mem.alignment;
    const uint offset = GetReader()->m_currentNode.mem.offset;

    if (alignment > naturalAlignment)
    {
        throw WasmCompilationException(_u("alignment must not be larger than natural"));
    }

    EmitInfo rhsInfo;
    if (isStore)
    {
        rhsInfo = PopEvalStack(type, _u("Invalid type for store op"));
    }
    EmitInfo exprInfo = PopEvalStack(WasmTypes::I32, _u("Index expression must be of type i32"));

    if (isStore)
    {
        m_writer->AsmSimdTypedArr(op, rhsInfo.location, exprInfo.location, dataWidth, viewType, offset);

        ReleaseLocation(&rhsInfo);
        ReleaseLocation(&exprInfo);

        return EmitInfo();
    }

    Js::RegSlot resultReg = GetRegisterSpace(type)->AcquireTmpRegister();
    m_writer->AsmSimdTypedArr(op, resultReg, exprInfo.location, dataWidth, viewType, offset);

    EmitInfo yieldInfo = EmitInfo(resultReg, type);
    ReleaseLocation(&exprInfo);

    return yieldInfo;
}